

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O0

void __thiscall SQFile::~SQFile(SQFile *this)

{
  SQFile *in_RDI;
  
  ~SQFile(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~SQFile() { Close(); }